

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void spr_read_tbl(DisasContext_conflict10 *ctx,int gprn,int sprn)

{
  TCGContext_conflict10 *pTVar1;
  ulong uVar2;
  uintptr_t o;
  TCGv_i32 pTVar3;
  ulong a2;
  TCGTemp *local_28;
  
  pTVar1 = ctx->uc->tcg_ctx;
  if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
    pTVar3 = tcg_const_i32_ppc64(pTVar1,1);
    tcg_gen_op3_ppc64(pTVar1,INDEX_op_st_i32,(TCGArg)(pTVar3 + (long)pTVar1),
                      (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0xffffffffffffe3dc);
    tcg_temp_free_internal_ppc64(pTVar1,(TCGTemp *)(pTVar3 + (long)pTVar1));
  }
  local_28 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
  tcg_gen_callN_ppc64(pTVar1,helper_load_tbl_ppc64,
                      (TCGTemp *)((long)&pTVar1->pool_cur + (long)cpu_gpr[gprn]),1,&local_28);
  if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
    pTVar3 = tcg_const_i32_ppc64(pTVar1,0);
    tcg_gen_op3_ppc64(pTVar1,INDEX_op_st_i32,(TCGArg)(pTVar3 + (long)pTVar1),
                      (TCGArg)(pTVar1->cpu_env + (long)pTVar1),0xffffffffffffe3dc);
    tcg_temp_free_internal_ppc64(pTVar1,(TCGTemp *)(pTVar3 + (long)pTVar1));
    uVar2 = (ctx->base).pc_next;
    pTVar1 = ctx->uc->tcg_ctx;
    a2 = uVar2 & 0xffffffff;
    if (ctx->sf_mode != false) {
      a2 = uVar2;
    }
    tcg_gen_op2_ppc64(pTVar1,INDEX_op_movi_i64,(TCGArg)(cpu_nip + (long)pTVar1),a2);
    ctx->exception = 0x200;
  }
  return;
}

Assistant:

static void spr_read_tbl(DisasContext *ctx, int gprn, int sprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    gen_helper_load_tbl(tcg_ctx, cpu_gpr[gprn], tcg_ctx->cpu_env);
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_end(tcg_ctx);
        gen_stop_exception(ctx);
    }
}